

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_siv_hw.c
# Opt level: O0

int aes_siv_cipher(void *vctx,uchar *out,uchar *in,size_t len)

{
  int iVar1;
  uint uVar2;
  uchar *in_RCX;
  uchar *in_RDX;
  SIV128_CONTEXT *in_RSI;
  uchar *in_RDI;
  SIV128_CONTEXT *sctx;
  PROV_AES_SIV_CTX *ctx;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDX == (uchar *)0x0) {
    iVar1 = ossl_siv128_finish((SIV128_CONTEXT *)(in_RDI + 0x18));
    uVar2 = (uint)(iVar1 == 0);
  }
  else if (in_RSI == (SIV128_CONTEXT *)0x0) {
    iVar1 = ossl_siv128_aad((SIV128_CONTEXT *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,0);
    uVar2 = (uint)(iVar1 == 1);
  }
  else if ((in_RDI[4] & 1) == 0) {
    iVar1 = ossl_siv128_decrypt((SIV128_CONTEXT *)ctx,(uchar *)sctx,
                                (uchar *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),(size_t)in_RDI);
    uVar2 = (uint)(0 < iVar1);
  }
  else {
    iVar1 = ossl_siv128_encrypt(in_RSI,in_RDX,in_RCX,(size_t)in_RDI);
    uVar2 = (uint)(0 < iVar1);
  }
  return uVar2;
}

Assistant:

static int aes_siv_cipher(void *vctx, unsigned char *out,
                          const unsigned char *in, size_t len)
{
    PROV_AES_SIV_CTX *ctx = (PROV_AES_SIV_CTX *)vctx;
    SIV128_CONTEXT *sctx = &ctx->siv;

    /* EncryptFinal or DecryptFinal */
    if (in == NULL)
        return ossl_siv128_finish(sctx) == 0;

    /* Deal with associated data */
    if (out == NULL)
        return (ossl_siv128_aad(sctx, in, len) == 1);

    if (ctx->enc)
        return ossl_siv128_encrypt(sctx, in, out, len) > 0;

    return ossl_siv128_decrypt(sctx, in, out, len) > 0;
}